

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

LogFormat * __thiscall el::base::LogFormat::operator=(LogFormat *this,LogFormat *logFormat)

{
  if (logFormat != this) {
    this->m_level = logFormat->m_level;
    std::__cxx11::string::_M_assign((string *)&this->m_userFormat);
    std::__cxx11::string::_M_assign((string *)&this->m_dateTimeFormat);
    this->m_flags = logFormat->m_flags;
    std::__cxx11::string::_M_assign((string *)&this->m_currentUser);
    std::__cxx11::string::_M_assign((string *)&this->m_currentHost);
  }
  return this;
}

Assistant:

LogFormat& LogFormat::operator=(const LogFormat& logFormat) {
  if (&logFormat != this) {
    m_level = logFormat.m_level;
    m_userFormat = logFormat.m_userFormat;
    m_dateTimeFormat = logFormat.m_dateTimeFormat;
    m_flags = logFormat.m_flags;
    m_currentUser = logFormat.m_currentUser;
    m_currentHost = logFormat.m_currentHost;
  }
  return *this;
}